

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

void findNotifyBits(void)

{
  callback_t *pcVar1;
  uint p2;
  
  p2 = 0;
  for (pcVar1 = gCallBackFirst; pcVar1 != (callback_t *)0x0; pcVar1 = pcVar1->next) {
    p2 = p2 | 1 << ((byte)pcVar1->gpio & 0x1f);
  }
  if (p2 == gNotifyBits) {
    return;
  }
  gNotifyBits = p2;
  pigpio_command(gPigCommand,0x13,gPigHandle,p2,1);
  return;
}

Assistant:

static void findNotifyBits(void)
{
   callback_t *p;
   uint32_t bits = 0;

   p = gCallBackFirst;

   while (p)
   {
      bits |= (1<<(p->gpio));
      p = p->next;
   }

   if (bits != gNotifyBits)
   {
      gNotifyBits = bits;
      pigpio_command(gPigCommand, PI_CMD_NB, gPigHandle, gNotifyBits, 1);
   }
}